

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aTextureMipmapTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Accuracy::Texture2DMipmapCase::init(Texture2DMipmapCase *this,EVP_PKEY_CTX *ctx)

{
  pointer pPVar1;
  uint uVar2;
  uint extraout_EAX;
  uint uVar3;
  Texture2D *this_00;
  int levelNdx;
  long lVar4;
  deUint32 step;
  Vec4 local_40;
  
  this_00 = (Texture2D *)operator_new(0x70);
  glu::Texture2D::Texture2D
            (this_00,this->m_renderCtx,this->m_format,this->m_dataType,this->m_width,this->m_height)
  ;
  this->m_texture = this_00;
  uVar3 = this->m_height;
  if (this->m_height < this->m_width) {
    uVar3 = this->m_width;
  }
  if (uVar3 != 0) {
    uVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    lVar4 = 0;
    levelNdx = 0;
    do {
      tcu::Texture2D::allocLevel(&this->m_texture->m_refTexture,levelNdx);
      pPVar1 = (this->m_texture->m_refTexture).super_TextureLevelPyramid.m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start;
      tcu::RGBA::toVec((RGBA *)&local_40);
      tcu::clear((PixelBufferAccess *)
                 ((long)(pPVar1->super_ConstPixelBufferAccess).m_size.m_data + lVar4 + -8),&local_40
                );
      levelNdx = levelNdx + 1;
      lVar4 = lVar4 + 0x28;
      uVar3 = extraout_EAX;
    } while ((ulong)((uVar2 ^ 0xffffffe0) + 0x21) * 0x28 != lVar4);
  }
  return uVar3;
}

Assistant:

void Texture2DMipmapCase::init (void)
{
	m_texture = new glu::Texture2D(m_renderCtx, m_format, m_dataType, m_width, m_height);

	int numLevels = deLog2Floor32(de::max(m_width, m_height))+1;

	// Fill texture with colored grid.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		deUint32	step		= 0xff / (numLevels-1);
		deUint32	inc			= deClamp32(step*levelNdx, 0x00, 0xff);
		deUint32	dec			= 0xff - inc;
		deUint32	rgb			= (inc << 16) | (dec << 8) | 0xff;
		deUint32	color		= 0xff000000 | rgb;

		m_texture->getRefTexture().allocLevel(levelNdx);
		tcu::clear(m_texture->getRefTexture().getLevel(levelNdx), tcu::RGBA(color).toVec());
	}
}